

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detached_buffer.h
# Opt level: O0

void __thiscall flatbuffers::DetachedBuffer::reset(DetachedBuffer *this)

{
  DetachedBuffer *this_local;
  
  this->allocator_ = (Allocator *)0x0;
  this->own_allocator_ = false;
  this->buf_ = (uint8_t *)0x0;
  this->reserved_ = 0;
  this->cur_ = (uint8_t *)0x0;
  this->size_ = 0;
  return;
}

Assistant:

inline void reset() {
    allocator_ = nullptr;
    own_allocator_ = false;
    buf_ = nullptr;
    reserved_ = 0;
    cur_ = nullptr;
    size_ = 0;
  }